

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void LiteScript::StateExecutor::I_VALUE_NUMBER(State *state,Instruction *instr)

{
  reference this;
  Object *this_00;
  Number *this_01;
  Number number;
  Instruction *instr_local;
  State *state_local;
  
  state->line_num = state->line_num + 1;
  number = (Number)instr;
  Number::Number((Number *)&stack0xffffffffffffffe0);
  if (*(char *)((long)number + 1) == '\x02') {
    Number::Number((Number *)&stack0xffffffffffffffd8,*(int *)((long)number + 8));
    Number::operator=((Number *)&stack0xffffffffffffffe0,(Number *)&stack0xffffffffffffffd8);
  }
  else {
    if (*(char *)((long)number + 1) != '\x03') {
      return;
    }
    Number::Number((Number *)&stack0xffffffffffffffd0,*(float *)((long)number + 8));
    Number::operator=((Number *)&stack0xffffffffffffffe0,(Number *)&stack0xffffffffffffffd0);
  }
  Memory::Create((Memory *)&stack0xffffffffffffffc0,(Type *)state->memory);
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
            (&state->op_lifo,(value_type *)&stack0xffffffffffffffc0);
  Variable::~Variable((Variable *)&stack0xffffffffffffffc0);
  this = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                   (&state->op_lifo);
  this_00 = Variable::operator->(this);
  this_01 = Object::GetData<LiteScript::Number>(this_00);
  Number::operator=(this_01,(Number *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void LiteScript::StateExecutor::I_VALUE_NUMBER(State& state, Instruction& instr) {
    state.line_num++;
    Number number;
    if (instr.comp_type == Instruction::CompType::COMP_TYPE_INTEGER)
        number = Number(instr.comp_value.v_integer);
    else if (instr.comp_type == Instruction::CompType::COMP_TYPE_FLOAT)
        number = Number(instr.comp_value.v_float);
    else
        return;
    state.op_lifo.push_back(state.memory.Create(Type::NUMBER));
    state.op_lifo.back()->GetData<Number>() = number;
}